

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTypes.h
# Opt level: O0

char * glslang::GetStorageQualifierString(TStorageQualifier q)

{
  char *pcStack_10;
  TStorageQualifier q_local;
  
  switch(q) {
  case EvqTemporary:
    pcStack_10 = "temp";
    break;
  case EvqGlobal:
    pcStack_10 = "global";
    break;
  case EvqConst:
    pcStack_10 = "const";
    break;
  case EvqVaryingIn:
    pcStack_10 = "in";
    break;
  case EvqVaryingOut:
    pcStack_10 = "out";
    break;
  case EvqUniform:
    pcStack_10 = "uniform";
    break;
  case EvqBuffer:
    pcStack_10 = "buffer";
    break;
  case EvqShared:
    pcStack_10 = "shared";
    break;
  case EvqSpirvStorageClass:
    pcStack_10 = "spirv_storage_class";
    break;
  case EvqPayload:
    pcStack_10 = "rayPayloadNV";
    break;
  case EvqPayloadIn:
    pcStack_10 = "rayPayloadInNV";
    break;
  case EvqHitAttr:
    pcStack_10 = "hitAttributeNV";
    break;
  case EvqCallableData:
    pcStack_10 = "callableDataNV";
    break;
  case EvqCallableDataIn:
    pcStack_10 = "callableDataInNV";
    break;
  case EvqHitObjectAttrNV:
    pcStack_10 = "hitObjectAttributeNV";
    break;
  case EvqtaskPayloadSharedEXT:
    pcStack_10 = "taskPayloadSharedEXT";
    break;
  case EvqIn:
    pcStack_10 = "in";
    break;
  case EvqOut:
    pcStack_10 = "out";
    break;
  case EvqInOut:
    pcStack_10 = "inout";
    break;
  case EvqConstReadOnly:
    pcStack_10 = "const (read only)";
    break;
  case EvqVertexId:
    pcStack_10 = "gl_VertexId";
    break;
  case EvqInstanceId:
    pcStack_10 = "gl_InstanceId";
    break;
  case EvqPosition:
    pcStack_10 = "gl_Position";
    break;
  case EvqPointSize:
    pcStack_10 = "gl_PointSize";
    break;
  case EvqClipVertex:
    pcStack_10 = "gl_ClipVertex";
    break;
  case EvqFace:
    pcStack_10 = "gl_FrontFacing";
    break;
  case EvqFragCoord:
    pcStack_10 = "gl_FragCoord";
    break;
  case EvqPointCoord:
    pcStack_10 = "gl_PointCoord";
    break;
  case EvqFragColor:
    pcStack_10 = "fragColor";
    break;
  case EvqFragDepth:
    pcStack_10 = "gl_FragDepth";
    break;
  case EvqFragStencil:
    pcStack_10 = "gl_FragStencilRefARB";
    break;
  default:
    pcStack_10 = "unknown qualifier";
  }
  return pcStack_10;
}

Assistant:

__inline const char* GetStorageQualifierString(TStorageQualifier q)
{
    switch (q) {
    case EvqTemporary:      return "temp";           break;
    case EvqGlobal:         return "global";         break;
    case EvqConst:          return "const";          break;
    case EvqConstReadOnly:  return "const (read only)"; break;
    case EvqSpirvStorageClass: return "spirv_storage_class"; break;
    case EvqVaryingIn:      return "in";             break;
    case EvqVaryingOut:     return "out";            break;
    case EvqUniform:        return "uniform";        break;
    case EvqBuffer:         return "buffer";         break;
    case EvqShared:         return "shared";         break;
    case EvqIn:             return "in";             break;
    case EvqOut:            return "out";            break;
    case EvqInOut:          return "inout";          break;
    case EvqVertexId:       return "gl_VertexId";    break;
    case EvqInstanceId:     return "gl_InstanceId";  break;
    case EvqPosition:       return "gl_Position";    break;
    case EvqPointSize:      return "gl_PointSize";   break;
    case EvqClipVertex:     return "gl_ClipVertex";  break;
    case EvqFace:           return "gl_FrontFacing"; break;
    case EvqFragCoord:      return "gl_FragCoord";   break;
    case EvqPointCoord:     return "gl_PointCoord";  break;
    case EvqFragColor:      return "fragColor";      break;
    case EvqFragDepth:      return "gl_FragDepth";   break;
    case EvqFragStencil:    return "gl_FragStencilRefARB"; break;
    case EvqPayload:        return "rayPayloadNV";     break;
    case EvqPayloadIn:      return "rayPayloadInNV";   break;
    case EvqHitAttr:        return "hitAttributeNV";   break;
    case EvqCallableData:   return "callableDataNV";   break;
    case EvqCallableDataIn: return "callableDataInNV"; break;
    case EvqtaskPayloadSharedEXT: return "taskPayloadSharedEXT"; break;
    case EvqHitObjectAttrNV:return "hitObjectAttributeNV"; break;
    default:                return "unknown qualifier";
    }
}